

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O0

void __thiscall
wasm::
AnalysisChecker<wasm::analysis::FiniteIntPowersetLattice,_wasm::analysis::LivenessTransferFunction>
::checkTransferFunction
          (AnalysisChecker<wasm::analysis::FiniteIntPowersetLattice,_wasm::analysis::LivenessTransferFunction>
           *this,CFG *cfg,Element *x,Element *y,Element *z)

{
  _Bit_pointer *this_00;
  bool bVar1;
  reference bb_00;
  undefined1 local_d8 [8];
  Element zResult;
  undefined1 local_a0 [8];
  Element yResult;
  Element xResult;
  BasicBlock *bb;
  iterator __end2;
  iterator __begin2;
  CFG *__range2;
  Element *z_local;
  Element *y_local;
  Element *x_local;
  CFG *cfg_local;
  AnalysisChecker<wasm::analysis::FiniteIntPowersetLattice,_wasm::analysis::LivenessTransferFunction>
  *this_local;
  
  __end2 = analysis::CFG::begin(cfg);
  bb = (BasicBlock *)analysis::CFG::end(cfg);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_wasm::analysis::BasicBlock_*,_std::vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>_>
                                *)&bb);
    if (!bVar1) break;
    bb_00 = __gnu_cxx::
            __normal_iterator<const_wasm::analysis::BasicBlock_*,_std::vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>_>
            ::operator*(&__end2);
    this_00 = &yResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_end_of_storage;
    analysis::FiniteIntPowersetLattice::Element::Element((Element *)this_00,x);
    analysis::
    VisitorTransferFunc<wasm::analysis::LivenessTransferFunction,_wasm::analysis::FiniteIntPowersetLattice,_(wasm::analysis::AnalysisDirection)1>
    ::transfer(&this->txfn->
                super_VisitorTransferFunc<wasm::analysis::LivenessTransferFunction,_wasm::analysis::FiniteIntPowersetLattice,_(wasm::analysis::AnalysisDirection)1>
               ,bb_00,(Element *)this_00);
    analysis::FiniteIntPowersetLattice::Element::Element((Element *)local_a0,y);
    analysis::
    VisitorTransferFunc<wasm::analysis::LivenessTransferFunction,_wasm::analysis::FiniteIntPowersetLattice,_(wasm::analysis::AnalysisDirection)1>
    ::transfer(&this->txfn->
                super_VisitorTransferFunc<wasm::analysis::LivenessTransferFunction,_wasm::analysis::FiniteIntPowersetLattice,_(wasm::analysis::AnalysisDirection)1>
               ,bb_00,(Element *)local_a0);
    analysis::FiniteIntPowersetLattice::Element::Element((Element *)local_d8,z);
    analysis::
    VisitorTransferFunc<wasm::analysis::LivenessTransferFunction,_wasm::analysis::FiniteIntPowersetLattice,_(wasm::analysis::AnalysisDirection)1>
    ::transfer(&this->txfn->
                super_VisitorTransferFunc<wasm::analysis::LivenessTransferFunction,_wasm::analysis::FiniteIntPowersetLattice,_(wasm::analysis::AnalysisDirection)1>
               ,bb_00,(Element *)local_d8);
    checkMonotonicity(this,bb_00,x,y,
                      (Element *)
                      &yResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage,(Element *)local_a0);
    checkMonotonicity(this,bb_00,x,z,
                      (Element *)
                      &yResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage,(Element *)local_d8);
    checkMonotonicity(this,bb_00,y,z,(Element *)local_a0,(Element *)local_d8);
    analysis::FiniteIntPowersetLattice::Element::~Element((Element *)local_d8);
    analysis::FiniteIntPowersetLattice::Element::~Element((Element *)local_a0);
    analysis::FiniteIntPowersetLattice::Element::~Element
              ((Element *)
               &yResult.bitvector.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<const_wasm::analysis::BasicBlock_*,_std::vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void checkTransferFunction(CFG& cfg,
                             typename L::Element x,
                             typename L::Element y,
                             typename L::Element z) {
    for (const auto& bb : cfg) {
      // Apply transfer function on each lattice element.
      auto xResult = x;
      txfn.transfer(bb, xResult);
      auto yResult = y;
      txfn.transfer(bb, yResult);
      auto zResult = z;
      txfn.transfer(bb, zResult);

      // Check monotonicity for every pair of transfer function outputs.
      checkMonotonicity(bb, x, y, xResult, yResult);
      checkMonotonicity(bb, x, z, xResult, zResult);
      checkMonotonicity(bb, y, z, yResult, zResult);
    }
  }